

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_state.cc
# Opt level: O0

void __thiscall StateVar::GenSetFunction(StateVar *this,Output *out_h,Env *env)

{
  undefined8 uVar1;
  ID *id;
  char *pcVar2;
  ID *in_RSI;
  Env *in_stack_ffffffffffffff70;
  Type *in_stack_ffffffffffffff98;
  string local_58 [32];
  string local_38 [56];
  
  set_function_abi_cxx11_(in_RSI);
  uVar1 = std::__cxx11::string::c_str();
  Type::DataTypeConstRefStr_abi_cxx11_(in_stack_ffffffffffffff98);
  id = (ID *)std::__cxx11::string::c_str();
  pcVar2 = Env::LValue(in_stack_ffffffffffffff70,id);
  Output::println((Output *)in_RSI,"void %s(%s x) \t{ %s = x; }",uVar1,id,pcVar2);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void StateVar::GenSetFunction(Output* out_h, Env* env)
	{
	out_h->println("void %s(%s x) 	{ %s = x; }", set_function(id_).c_str(),
	               type_->DataTypeConstRefStr().c_str(), env->LValue(id_));
	}